

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O1

DecodeStatus DecodeReturn(MCInst *MI,uint insn,uint64_t Address,void *Decoder)

{
  MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(insn >> 0xc & 0x7c)));
  if ((insn >> 0xd & 1) == 0) {
    MCOperand_CreateReg0(MI,IntRegDecoderTable[insn & 0x1f]);
  }
  else {
    MCOperand_CreateImm0(MI,(ulong)(uint)((int)(insn << 0x13) >> 0x13));
  }
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeReturn(MCInst *MI, unsigned insn, uint64_t Address,
		const void *Decoder)
{
	DecodeStatus status;
	unsigned rs1 = fieldFromInstruction_4(insn, 14, 5);
	unsigned isImm = fieldFromInstruction_4(insn, 13, 1);
	unsigned rs2 = 0;
	unsigned simm13 = 0;
	if (isImm)
		simm13 = SignExtend32(fieldFromInstruction_4(insn, 0, 13), 13);
	else
		rs2 = fieldFromInstruction_4(insn, 0, 5);

	// Decode RS1.
	status = DecodeIntRegsRegisterClass(MI, rs1, Address, Decoder);
	if (status != MCDisassembler_Success)
		return status;

	// Decode RS2 | SIMM13.
	if (isImm)
		MCOperand_CreateImm0(MI, simm13);
	else {
		status = DecodeIntRegsRegisterClass(MI, rs2, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	return MCDisassembler_Success;
}